

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O3

void test_bson_iter_overwrite_decimal128(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  undefined1 *puVar4;
  char *pcVar5;
  ulong uVar6;
  undefined8 *puVar7;
  bson_t *pbVar8;
  bson_t *pbVar9;
  bson_t *pbVar10;
  TestSuite *suite;
  bson_t *pbVar11;
  undefined1 auVar12 [16];
  bson_decimal128_t new_value;
  bson_decimal128_t iter_value;
  bson_iter_t iter;
  bson_decimal128_t value;
  bson_t b;
  undefined1 auStack_1e18 [4104];
  bson_t *pbStack_e10;
  code *pcStack_e08;
  undefined8 uStack_d90;
  undefined1 uStack_d88;
  TestSuite aTStack_d80 [5];
  code *pcStack_c88;
  int *piStack_c10;
  int iStack_c08;
  undefined1 auStack_c04 [4];
  undefined1 auStack_c00 [232];
  bson_t *pbStack_b18;
  undefined1 *puStack_b10;
  code *pcStack_b08;
  bson_t bStack_b00;
  bson_t abStack_a80 [2];
  undefined8 uStack_948;
  char *pcStack_940;
  bson_t *pbStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  bson_t *pbStack_920;
  char *pcStack_918;
  code *pcStack_908;
  undefined1 auStack_900 [128];
  undefined1 auStack_880 [232];
  undefined1 *puStack_798;
  undefined1 *puStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [128];
  undefined1 auStack_700 [368];
  undefined1 *puStack_590;
  code *pcStack_588;
  undefined1 auStack_580 [128];
  undefined1 auStack_500 [128];
  undefined1 auStack_480 [128];
  undefined1 auStack_400 [368];
  undefined8 *puStack_290;
  code *apcStack_288 [13];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_210 [16];
  undefined8 local_200 [14];
  undefined8 local_190;
  undefined8 local_188;
  undefined1 local_180 [360];
  
  puVar7 = &local_190;
  local_188 = 0;
  local_190 = 1;
  uStack_218 = 0;
  local_220 = 2;
  puVar4 = local_180;
  apcStack_288[0] = (code *)0x12b51c;
  bson_init(puVar4);
  apcStack_288[0] = (code *)0x12b533;
  cVar1 = bson_append_decimal128(puVar4,"key",0xffffffff,puVar7);
  if (cVar1 == '\0') {
    apcStack_288[0] = (code *)0x12b603;
    test_bson_iter_overwrite_decimal128_cold_1();
LAB_0012b603:
    apcStack_288[0] = (code *)0x12b608;
    test_bson_iter_overwrite_decimal128_cold_2();
LAB_0012b608:
    apcStack_288[0] = (code *)0x12b60d;
    test_bson_iter_overwrite_decimal128_cold_3();
LAB_0012b60d:
    apcStack_288[0] = (code *)0x12b612;
    test_bson_iter_overwrite_decimal128_cold_4();
LAB_0012b612:
    apcStack_288[0] = (code *)0x12b617;
    test_bson_iter_overwrite_decimal128_cold_5();
LAB_0012b617:
    apcStack_288[0] = (code *)0x12b61c;
    test_bson_iter_overwrite_decimal128_cold_6();
  }
  else {
    apcStack_288[0] = (code *)0x12b557;
    cVar1 = bson_iter_init_find(local_200,local_180,"key");
    if (cVar1 == '\0') goto LAB_0012b603;
    apcStack_288[0] = (code *)0x12b56c;
    iVar2 = bson_iter_type(local_200);
    if (iVar2 != 0x13) goto LAB_0012b608;
    puVar7 = local_200;
    apcStack_288[0] = (code *)0x12b58a;
    bson_iter_overwrite_decimal128(puVar7,&local_220);
    apcStack_288[0] = (code *)0x12b5a1;
    cVar1 = bson_iter_init_find(puVar7,local_180,"key");
    if (cVar1 == '\0') goto LAB_0012b60d;
    apcStack_288[0] = (code *)0x12b5b2;
    iVar2 = bson_iter_type(local_200);
    if (iVar2 != 0x13) goto LAB_0012b612;
    apcStack_288[0] = (code *)0x12b5c9;
    cVar1 = bson_iter_decimal128(local_200,local_210);
    if (cVar1 == '\0') goto LAB_0012b617;
    auVar12[0] = -((char)local_220 == local_210[0]);
    auVar12[1] = -(local_220._1_1_ == local_210[1]);
    auVar12[2] = -(local_220._2_1_ == local_210[2]);
    auVar12[3] = -(local_220._3_1_ == local_210[3]);
    auVar12[4] = -(local_220._4_1_ == local_210[4]);
    auVar12[5] = -(local_220._5_1_ == local_210[5]);
    auVar12[6] = -(local_220._6_1_ == local_210[6]);
    auVar12[7] = -(local_220._7_1_ == local_210[7]);
    auVar12[8] = -((char)uStack_218 == local_210[8]);
    auVar12[9] = -(uStack_218._1_1_ == local_210[9]);
    auVar12[10] = -(uStack_218._2_1_ == local_210[10]);
    auVar12[0xb] = -(uStack_218._3_1_ == local_210[0xb]);
    auVar12[0xc] = -(uStack_218._4_1_ == local_210[0xc]);
    auVar12[0xd] = -(uStack_218._5_1_ == local_210[0xd]);
    auVar12[0xe] = -(uStack_218._6_1_ == local_210[0xe]);
    auVar12[0xf] = -(uStack_218._7_1_ == local_210[0xf]);
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
                ) == 0xffff) {
      apcStack_288[0] = (code *)0x12b5f5;
      bson_destroy(local_180);
      return;
    }
  }
  apcStack_288[0] = test_bson_iter_recurse;
  test_bson_iter_overwrite_decimal128_cold_7();
  pcStack_588 = (code *)0x12b63e;
  puStack_290 = puVar7;
  apcStack_288[0] = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_400);
  pcStack_588 = (code *)0x12b64e;
  bson_init(auStack_500);
  pcStack_588 = (code *)0x12b664;
  cVar1 = bson_append_int32(auStack_500,"0",1,0);
  if (cVar1 == '\0') {
    pcStack_588 = (code *)0x12b79e;
    test_bson_iter_recurse_cold_1();
LAB_0012b79e:
    pcStack_588 = (code *)0x12b7a3;
    test_bson_iter_recurse_cold_2();
LAB_0012b7a3:
    pcStack_588 = (code *)0x12b7a8;
    test_bson_iter_recurse_cold_3();
LAB_0012b7a8:
    pcStack_588 = (code *)0x12b7ad;
    test_bson_iter_recurse_cold_4();
LAB_0012b7ad:
    pcStack_588 = (code *)0x12b7b2;
    test_bson_iter_recurse_cold_5();
LAB_0012b7b2:
    pcStack_588 = (code *)0x12b7b7;
    test_bson_iter_recurse_cold_6();
LAB_0012b7b7:
    pcStack_588 = (code *)0x12b7bc;
    test_bson_iter_recurse_cold_7();
LAB_0012b7bc:
    pcStack_588 = (code *)0x12b7c1;
    test_bson_iter_recurse_cold_8();
LAB_0012b7c1:
    pcStack_588 = (code *)0x12b7c6;
    test_bson_iter_recurse_cold_9();
LAB_0012b7c6:
    pcStack_588 = (code *)0x12b7cb;
    test_bson_iter_recurse_cold_10();
  }
  else {
    pcStack_588 = (code *)0x12b68a;
    cVar1 = bson_append_int32(auStack_500,"1",1,1);
    if (cVar1 == '\0') goto LAB_0012b79e;
    pcStack_588 = (code *)0x12b6b0;
    cVar1 = bson_append_int32(auStack_500,"2",1,2);
    if (cVar1 == '\0') goto LAB_0012b7a3;
    pcStack_588 = (code *)0x12b6d9;
    cVar1 = bson_append_array(auStack_400,"key",0xffffffff,auStack_500);
    if (cVar1 == '\0') goto LAB_0012b7a8;
    pcStack_588 = (code *)0x12b6fd;
    cVar1 = bson_iter_init_find(auStack_480,auStack_400,"key");
    if (cVar1 == '\0') goto LAB_0012b7ad;
    pcStack_588 = (code *)0x12b712;
    iVar2 = bson_iter_type(auStack_480);
    if (iVar2 != 4) goto LAB_0012b7b2;
    pcStack_588 = (code *)0x12b72b;
    cVar1 = bson_iter_recurse(auStack_480,auStack_580);
    if (cVar1 == '\0') goto LAB_0012b7b7;
    pcStack_588 = (code *)0x12b742;
    cVar1 = bson_iter_find(auStack_580,"0");
    if (cVar1 == '\0') goto LAB_0012b7bc;
    pcStack_588 = (code *)0x12b755;
    cVar1 = bson_iter_find(auStack_580,"1");
    if (cVar1 == '\0') goto LAB_0012b7c1;
    pcStack_588 = (code *)0x12b768;
    cVar1 = bson_iter_find(auStack_580,"2");
    if (cVar1 == '\0') goto LAB_0012b7c6;
    pcStack_588 = (code *)0x12b774;
    cVar1 = bson_iter_next(auStack_580);
    if (cVar1 == '\0') {
      pcStack_588 = (code *)0x12b785;
      bson_destroy(auStack_400);
      pcStack_588 = (code *)0x12b792;
      bson_destroy(auStack_500);
      return;
    }
  }
  pcStack_588 = test_bson_iter_init_find_case;
  test_bson_iter_recurse_cold_11();
  pcStack_788 = (code *)0x12b7f0;
  puStack_590 = auStack_500;
  pcStack_588 = (code *)apcStack_288;
  bson_init(auStack_700);
  pcStack_788 = (code *)0x12b809;
  cVar1 = bson_append_int32(auStack_700,"FOO",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_788 = (code *)0x12b850;
    test_bson_iter_init_find_case_cold_1();
LAB_0012b850:
    pcStack_788 = (code *)0x12b855;
    test_bson_iter_init_find_case_cold_2();
  }
  else {
    pcStack_788 = (code *)0x12b824;
    cVar1 = bson_iter_init_find_case(auStack_780,auStack_700,"foo");
    if (cVar1 == '\0') goto LAB_0012b850;
    pcStack_788 = (code *)0x12b830;
    iVar2 = bson_iter_int32(auStack_780);
    if (iVar2 == 0x4d2) {
      pcStack_788 = (code *)0x12b844;
      bson_destroy(auStack_700);
      return;
    }
  }
  pcStack_788 = test_bson_iter_find_descendant;
  test_bson_iter_init_find_case_cold_3();
  pcStack_908 = (code *)0x12b878;
  puStack_798 = auStack_700;
  puStack_790 = puVar4;
  pcStack_788 = (code *)&pcStack_588;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                   );
  pcStack_908 = (code *)0x12b88b;
  cVar1 = bson_iter_init(auStack_880,pbVar3);
  if (cVar1 == '\0') {
    pcStack_908 = (code *)0x12bab0;
    test_bson_iter_find_descendant_cold_1();
LAB_0012bab0:
    pcStack_908 = (code *)0x12bab5;
    test_bson_iter_find_descendant_cold_2();
LAB_0012bab5:
    pcStack_908 = (code *)0x12baba;
    test_bson_iter_find_descendant_cold_3();
LAB_0012baba:
    pcStack_908 = (code *)0x12babf;
    test_bson_iter_find_descendant_cold_4();
LAB_0012babf:
    pcStack_908 = (code *)0x12bac4;
    test_bson_iter_find_descendant_cold_5();
LAB_0012bac4:
    pcStack_908 = (code *)0x12bac9;
    test_bson_iter_find_descendant_cold_6();
LAB_0012bac9:
    pcStack_908 = (code *)0x12bace;
    test_bson_iter_find_descendant_cold_7();
LAB_0012bace:
    pcStack_908 = (code *)0x12bad3;
    test_bson_iter_find_descendant_cold_8();
LAB_0012bad3:
    pcStack_908 = (code *)0x12bad8;
    test_bson_iter_find_descendant_cold_9();
LAB_0012bad8:
    pcStack_908 = (code *)0x12badd;
    test_bson_iter_find_descendant_cold_10();
LAB_0012badd:
    pcStack_908 = (code *)0x12bae2;
    test_bson_iter_find_descendant_cold_11();
LAB_0012bae2:
    pcStack_908 = (code *)0x12bae7;
    test_bson_iter_find_descendant_cold_12();
LAB_0012bae7:
    pcStack_908 = (code *)0x12baec;
    test_bson_iter_find_descendant_cold_13();
  }
  else {
    pcStack_908 = (code *)0x12b8aa;
    cVar1 = bson_iter_find_descendant(auStack_880,"a.b.c.0",auStack_900);
    if (cVar1 == '\0') goto LAB_0012bab0;
    pcStack_908 = (code *)0x12b8ba;
    iVar2 = bson_iter_type(auStack_900);
    if (iVar2 != 0x10) goto LAB_0012bab5;
    pcStack_908 = (code *)0x12b8cb;
    iVar2 = bson_iter_int32(auStack_900);
    if (iVar2 != 1) goto LAB_0012baba;
    pcStack_908 = (code *)0x12b8dc;
    bson_destroy(pbVar3);
    pcStack_908 = (code *)0x12b8e1;
    pbVar3 = (bson_t *)bson_bcon_magic();
    pcStack_908 = (code *)0x0;
    pcStack_918 = "]";
    pbStack_920 = (bson_t *)0x14ad57;
    uStack_928 = 1;
    uStack_930 = 0xf;
    pcStack_940 = "baz";
    uStack_948 = 0x12b930;
    pbStack_938 = pbVar3;
    puVar4 = (undefined1 *)bcon_new(0,"foo","{","bar","[","{");
    pcStack_908 = (code *)0x12b947;
    cVar1 = bson_iter_init(auStack_880,puVar4);
    if (cVar1 == '\0') goto LAB_0012babf;
    pcStack_908 = (code *)0x12b966;
    cVar1 = bson_iter_find_descendant(auStack_880,"foo.bar.0.baz",auStack_900);
    if (cVar1 == '\0') goto LAB_0012bac4;
    pcStack_908 = (code *)0x12b976;
    iVar2 = bson_iter_type(auStack_900);
    if (iVar2 != 0x10) goto LAB_0012bac9;
    pcStack_908 = (code *)0x12b987;
    iVar2 = bson_iter_int32(auStack_900);
    if (iVar2 != 1) goto LAB_0012bace;
    pcStack_908 = (code *)0x12b998;
    bson_destroy(puVar4);
    pcStack_908 = (code *)0x0;
    pcStack_918 = (char *)0xf;
    uStack_928 = 0x12b9c4;
    pbStack_920 = pbVar3;
    puVar4 = (undefined1 *)bcon_new(0,"nModified",pbVar3,0xf,1,"n");
    pcStack_908 = (code *)0x12b9db;
    cVar1 = bson_iter_init(auStack_880,puVar4);
    if (cVar1 == '\0') goto LAB_0012bad3;
    pcStack_908 = (code *)0x12b9fa;
    cVar1 = bson_iter_find_descendant(auStack_880,"n",auStack_900);
    if (cVar1 == '\0') goto LAB_0012bad8;
    pcStack_908 = (code *)0x12ba0a;
    pcVar5 = (char *)bson_iter_key(auStack_900);
    if ((*pcVar5 != 'n') || (pcVar5[1] != '\0')) goto LAB_0012badd;
    pcStack_908 = (code *)0x12ba25;
    bson_destroy(puVar4);
    pcStack_908 = (code *)0x0;
    pcStack_918 = (char *)0xf;
    uStack_928 = 0x12ba51;
    pbStack_920 = pbVar3;
    pbVar3 = (bson_t *)bcon_new(0,"",pbVar3,0xf,1,"n");
    pcStack_908 = (code *)0x12ba68;
    cVar1 = bson_iter_init(auStack_880,pbVar3);
    if (cVar1 == '\0') goto LAB_0012bae2;
    pcStack_908 = (code *)0x12ba83;
    cVar1 = bson_iter_find_descendant(auStack_880,"n",auStack_900);
    if (cVar1 == '\0') goto LAB_0012bae7;
    pcStack_908 = (code *)0x12ba8f;
    pcVar5 = (char *)bson_iter_key(auStack_900);
    if ((*pcVar5 == 'n') && (pcVar5[1] == '\0')) {
      pcStack_908 = (code *)0x12baa2;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_908 = test_bson_iter_as_bool;
  test_bson_iter_find_descendant_cold_14();
  pbVar9 = &bStack_b00;
  pbVar10 = &bStack_b00;
  pbVar11 = &bStack_b00;
  pbVar8 = abStack_a80;
  pcStack_b08 = (code *)0x12bb15;
  pbStack_920 = pbVar3;
  pcStack_918 = puVar4;
  pcStack_908 = (code *)&pcStack_788;
  bson_init(pbVar8);
  pcStack_b08 = (code *)0x12bb2e;
  bson_append_int32(pbVar8,"int32[true]",0xffffffff,1);
  pcStack_b08 = (code *)0x12bb44;
  bson_append_int32(pbVar8,"int32[false]",0xffffffff,0);
  pcStack_b08 = (code *)0x12bb60;
  bson_append_int64(pbVar8,"int64[true]",0xffffffff,1);
  pcStack_b08 = (code *)0x12bb79;
  bson_append_int64(pbVar8,"int64[false]",0xffffffff,0);
  pcStack_b08 = (code *)0x12bb91;
  bson_append_double(0x3ff0000000000000,pbVar8,"int64[true]",0xffffffff);
  pcStack_b08 = (code *)0x12bba4;
  bson_append_double(pbVar8,"int64[false]",0xffffffff);
  pcStack_b08 = (code *)0x12bbb2;
  bson_iter_init(&bStack_b00,pbVar8);
  pcStack_b08 = (code *)0x12bbba;
  bson_iter_next(&bStack_b00);
  pcStack_b08 = (code *)0x12bbc2;
  cVar1 = bson_iter_as_bool(&bStack_b00);
  if (cVar1 == '\0') {
    pcStack_b08 = (code *)0x12bc5a;
    test_bson_iter_as_bool_cold_1();
LAB_0012bc5a:
    pcStack_b08 = (code *)0x12bc5f;
    test_bson_iter_as_bool_cold_6();
LAB_0012bc5f:
    pbVar9 = pbVar8;
    pcStack_b08 = (code *)0x12bc64;
    test_bson_iter_as_bool_cold_2();
LAB_0012bc64:
    pcStack_b08 = (code *)0x12bc69;
    test_bson_iter_as_bool_cold_5();
LAB_0012bc69:
    pbVar10 = pbVar9;
    pcStack_b08 = (code *)0x12bc6e;
    test_bson_iter_as_bool_cold_3();
  }
  else {
    pcStack_b08 = (code *)0x12bbd5;
    bson_iter_next(&bStack_b00);
    pcStack_b08 = (code *)0x12bbdd;
    cVar1 = bson_iter_as_bool(&bStack_b00);
    pbVar8 = &bStack_b00;
    if (cVar1 != '\0') goto LAB_0012bc5a;
    pcStack_b08 = (code *)0x12bbec;
    bson_iter_next(&bStack_b00);
    pcStack_b08 = (code *)0x12bbf4;
    cVar1 = bson_iter_as_bool(&bStack_b00);
    pbVar8 = &bStack_b00;
    if (cVar1 == '\0') goto LAB_0012bc5f;
    pcStack_b08 = (code *)0x12bc03;
    bson_iter_next(&bStack_b00);
    pcStack_b08 = (code *)0x12bc0b;
    cVar1 = bson_iter_as_bool(&bStack_b00);
    if (cVar1 != '\0') goto LAB_0012bc64;
    pcStack_b08 = (code *)0x12bc1a;
    bson_iter_next(&bStack_b00);
    pcStack_b08 = (code *)0x12bc22;
    cVar1 = bson_iter_as_bool(&bStack_b00);
    pbVar9 = &bStack_b00;
    if (cVar1 == '\0') goto LAB_0012bc69;
    pcStack_b08 = (code *)0x12bc31;
    bson_iter_next(&bStack_b00);
    pcStack_b08 = (code *)0x12bc39;
    cVar1 = bson_iter_as_bool(&bStack_b00);
    if (cVar1 == '\0') {
      pcStack_b08 = (code *)0x12bc4a;
      bson_destroy(abStack_a80);
      return;
    }
  }
  pcStack_b08 = test_bson_iter_binary_deprecated;
  test_bson_iter_as_bool_cold_4();
  pcStack_c88 = (code *)0x12bc91;
  pbStack_b18 = pbVar10;
  puStack_b10 = (undefined1 *)&bStack_b00;
  pcStack_b08 = (code *)&pcStack_908;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                   );
  if (pbVar3 == (bson_t *)0x0) {
    pcStack_c88 = (code *)0x12bd06;
    test_bson_iter_binary_deprecated_cold_5();
LAB_0012bd06:
    pcStack_c88 = (code *)0x12bd0b;
    test_bson_iter_binary_deprecated_cold_1();
LAB_0012bd0b:
    pcStack_c88 = (code *)0x12bd10;
    test_bson_iter_binary_deprecated_cold_2();
LAB_0012bd10:
    pcStack_c88 = (code *)0x12bd15;
    test_bson_iter_binary_deprecated_cold_3();
  }
  else {
    pcStack_c88 = (code *)0x12bca9;
    cVar1 = bson_iter_init(auStack_c00,pbVar3);
    pbVar10 = pbVar3;
    if (cVar1 == '\0') goto LAB_0012bd06;
    pcStack_c88 = (code *)0x12bcba;
    cVar1 = bson_iter_next(auStack_c00);
    if (cVar1 == '\0') goto LAB_0012bd0b;
    pbVar11 = (bson_t *)&iStack_c08;
    pcStack_c88 = (code *)0x12bcdd;
    bson_iter_binary(auStack_c00,auStack_c04,pbVar11,&piStack_c10);
    if (iStack_c08 != 4) goto LAB_0012bd10;
    if (*piStack_c10 == 0x34333231) {
      pcStack_c88 = (code *)0x12bcf8;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_c88 = test_bson_iter_from_data;
  test_bson_iter_binary_deprecated_cold_4();
  uStack_d90 = 0x100620800000009;
  uStack_d88 = 0;
  suite = aTStack_d80;
  pcStack_e08 = (code *)0x12bd51;
  pcStack_c88 = (code *)&pcStack_b08;
  cVar1 = bson_iter_init_from_data(suite,&uStack_d90,9);
  if (cVar1 == '\0') {
    pcStack_e08 = (code *)0x12bd93;
    test_bson_iter_from_data_cold_1();
LAB_0012bd93:
    pcStack_e08 = (code *)0x12bd98;
    test_bson_iter_from_data_cold_2();
LAB_0012bd98:
    pcStack_e08 = (code *)0x12bd9d;
    test_bson_iter_from_data_cold_3();
  }
  else {
    suite = aTStack_d80;
    pcStack_e08 = (code *)0x12bd62;
    cVar1 = bson_iter_next();
    if (cVar1 == '\0') goto LAB_0012bd93;
    suite = aTStack_d80;
    pcStack_e08 = (code *)0x12bd73;
    iVar2 = bson_iter_type();
    if (iVar2 != 8) goto LAB_0012bd98;
    suite = aTStack_d80;
    pcStack_e08 = (code *)0x12bd85;
    cVar1 = bson_iter_bool();
    if (cVar1 != '\0') {
      return;
    }
  }
  pcStack_e08 = get_bson;
  test_bson_iter_from_data_cold_4();
  pbStack_e10 = pbVar10;
  pcStack_e08 = (code *)pbVar11;
  iVar2 = open((char *)suite,0);
  if (iVar2 != -1) {
    uVar6 = read(iVar2,auStack_1e18,0x1000);
    if ((long)uVar6 < 0) goto LAB_0012be04;
    if (uVar6 != 0) {
      bson_new_from_data(auStack_1e18,uVar6 & 0xffffffff);
      close(iVar2);
      return;
    }
    get_bson_cold_1();
  }
  get_bson_cold_3();
LAB_0012be04:
  get_bson_cold_2();
  TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
  TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
  TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
  TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
  TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
  TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
  TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
  TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
  TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
  TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
  TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
  TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
  TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                test_bson_as_canonical_extended_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
  TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
  TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
  TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
  TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
  TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
  TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
  TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
  TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
  TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
  TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
  TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
  TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
  TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
  TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
  TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
  TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
  TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
  TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
  TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
  TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
  TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
  TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
  TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
  TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
  TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
  TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
  TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
  TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
  TestSuite_Add(suite,"/bson/json/read/regex_options_order",test_bson_json_read_regex_options_order)
  ;
  TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
  TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
  TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
  TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
  TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
  TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
  TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
  TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
  TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
  TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
  TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
  TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
  TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
  TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
  TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
  TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
  TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
  TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
  TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
  TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
  TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
  TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
  TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
  TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
  TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
  TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
  return;
}

Assistant:

static void
test_bson_iter_overwrite_decimal128 (void)
{
   bson_iter_t iter;
   bson_t b;
   bson_decimal128_t value;
   bson_decimal128_t new_value;
   bson_decimal128_t iter_value;

   value.high = 0;
   value.low = 1;

   new_value.high = 0;
   new_value.low = 2;

   bson_init (&b);
   BSON_ASSERT (bson_append_decimal128 (&b, "key", -1, &value));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DECIMAL128 (&iter));
   bson_iter_overwrite_decimal128 (&iter, &new_value);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DECIMAL128 (&iter));
   BSON_ASSERT (bson_iter_decimal128 (&iter, &iter_value));
   BSON_ASSERT (memcmp (&iter_value, &new_value, sizeof (new_value)) == 0);
   bson_destroy (&b);
}